

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O3

void * arc4_ctx_alloc(void)

{
  mbedtls_arc4_context *ctx;
  
  ctx = (mbedtls_arc4_context *)calloc(1,0x108);
  if (ctx != (mbedtls_arc4_context *)0x0) {
    mbedtls_arc4_init(ctx);
  }
  return ctx;
}

Assistant:

static void * arc4_ctx_alloc( void )
{
    mbedtls_arc4_context *ctx;
    ctx = mbedtls_calloc( 1, sizeof( mbedtls_arc4_context ) );

    if( ctx == NULL )
        return( NULL );

    mbedtls_arc4_init( ctx );

    return( ctx );
}